

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef
          (EliminateDeadOutputStoresPass *this,Instruction *ref,Instruction *var)

{
  IRContext *pIVar1;
  DecorationManager *this_00;
  TypeManager *this_01;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  long lVar7;
  Instruction *this_02;
  uint uVar8;
  long *plVar9;
  uint32_t builtin;
  uint32_t local_8c;
  LivenessManager *local_88;
  DefUseManager *local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(pIVar1);
  }
  this_00 = (pIVar1->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  local_80 = (pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  this_01 = (pIVar1->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisLiveness) == kAnalysisNone) {
    IRContext::BuildLivenessManager(pIVar1);
  }
  local_88 = (pIVar1->liveness_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::LivenessManager_*,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::LivenessManager_*,_false>._M_head_impl;
  local_8c = 0x7fffffff;
  uVar3 = 0;
  if (var->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = &local_8c;
  pcStack_40 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:125:7)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:125:7)>
             ::_M_manager;
  analysis::DecorationManager::WhileEachDecoration
            (this_00,uVar3,0xb,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_8c == 0x7fffffff) {
    if (ref->opcode_ - OpPtrAccessChain < 0xfffffffe) {
      return;
    }
    uVar3 = 0;
    if (var->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(var,0);
    }
    pTVar6 = analysis::TypeManager::GetType(this_01,uVar3);
    iVar4 = (*pTVar6->_vptr_Type[0x21])(pTVar6);
    plVar9 = *(long **)(CONCAT44(extraout_var,iVar4) + 0x28);
    lVar7 = (**(code **)(*plVar9 + 0xc0))(plVar9);
    if (lVar7 == 0) {
      iVar4 = 1;
    }
    else {
      plVar9 = *(long **)(lVar7 + 0x28);
      iVar4 = 2;
    }
    pTVar6 = (Type *)(**(code **)(*plVar9 + 0xf0))(plVar9);
    uVar3 = analysis::TypeManager::GetId(this_01,pTVar6);
    uVar8 = (ref->has_result_id_ & 1) + 1;
    if (ref->has_type_id_ == false) {
      uVar8 = (uint)ref->has_result_id_;
    }
    uVar5 = Instruction::GetSingleWordOperand(ref,uVar8 + iVar4);
    this_02 = analysis::DefUseManager::GetDef(local_80,uVar5);
    if (this_02->opcode_ != OpConstant) {
      __assert_fail("member_idx_inst->opcode() == spv::Op::OpConstant && \"unexpected non-constant index\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp"
                    ,0x9c,
                    "void spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(Instruction *, Instruction *)"
                   );
    }
    uVar5 = (this_02->has_result_id_ & 1) + 1;
    if (this_02->has_type_id_ == false) {
      uVar5 = (uint)this_02->has_result_id_;
    }
    local_78._0_4_ = Instruction::GetSingleWordOperand(this_02,uVar5);
    local_78._4_4_ = 0;
    local_78._8_8_ = &local_8c;
    pcStack_60 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:160:7)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:160:7)>
               ::_M_manager;
    analysis::DecorationManager::WhileEachDecoration
              (this_00,uVar3,0xb,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_8c == 0x7fffffff) {
      __assert_fail("builtin != uint32_t(spv::BuiltIn::Max) && \"builtin not found\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp"
                    ,0xac,
                    "void spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(Instruction *, Instruction *)"
                   );
    }
  }
  bVar2 = analysis::LivenessManager::IsAnalyzedBuiltin(local_88,local_8c);
  if ((bVar2) && (bVar2 = IsLiveBuiltin(this,local_8c), !bVar2)) {
    KillAllStoresOfRef(this,ref);
  }
  return;
}

Assistant:

void EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(
    Instruction* ref, Instruction* var) {
  auto deco_mgr = context()->get_decoration_mgr();
  auto def_use_mgr = context()->get_def_use_mgr();
  auto type_mgr = context()->get_type_mgr();
  auto live_mgr = context()->get_liveness_mgr();
  // Search for builtin decoration of base variable
  uint32_t builtin = uint32_t(spv::BuiltIn::Max);
  auto var_id = var->result_id();
  (void)deco_mgr->WhileEachDecoration(
      var_id, uint32_t(spv::Decoration::BuiltIn),
      [&builtin](const Instruction& deco) {
        assert(deco.opcode() == spv::Op::OpDecorate && "unexpected decoration");
        builtin = deco.GetSingleWordInOperand(kOpDecorateBuiltInLiteralInIdx);
        return false;
      });
  // If analyzed builtin and not live, kill stores.
  if (builtin != uint32_t(spv::BuiltIn::Max)) {
    if (live_mgr->IsAnalyzedBuiltin(builtin) && !IsLiveBuiltin(builtin))
      KillAllStoresOfRef(ref);
    return;
  }
  // Search for builtin decoration on indexed member
  auto ref_op = ref->opcode();
  if (ref_op != spv::Op::OpAccessChain &&
      ref_op != spv::Op::OpInBoundsAccessChain) {
    return;
  }
  uint32_t in_idx = kOpAccessChainIdx0InIdx;
  analysis::Type* var_type = type_mgr->GetType(var->type_id());
  analysis::Pointer* ptr_type = var_type->AsPointer();
  auto curr_type = ptr_type->pointee_type();
  auto arr_type = curr_type->AsArray();
  if (arr_type) {
    curr_type = arr_type->element_type();
    ++in_idx;
  }
  auto str_type = curr_type->AsStruct();
  auto str_type_id = type_mgr->GetId(str_type);
  auto member_idx_id = ref->GetSingleWordInOperand(in_idx);
  auto member_idx_inst = def_use_mgr->GetDef(member_idx_id);
  assert(member_idx_inst->opcode() == spv::Op::OpConstant &&
         "unexpected non-constant index");
  auto ac_idx = member_idx_inst->GetSingleWordInOperand(kOpConstantValueInIdx);
  (void)deco_mgr->WhileEachDecoration(
      str_type_id, uint32_t(spv::Decoration::BuiltIn),
      [ac_idx, &builtin](const Instruction& deco) {
        assert(deco.opcode() == spv::Op::OpMemberDecorate &&
               "unexpected decoration");
        auto deco_idx =
            deco.GetSingleWordInOperand(kOpDecorateMemberMemberInIdx);
        if (deco_idx == ac_idx) {
          builtin =
              deco.GetSingleWordInOperand(kOpDecorateMemberBuiltInLiteralInIdx);
          return false;
        }
        return true;
      });
  assert(builtin != uint32_t(spv::BuiltIn::Max) && "builtin not found");
  // If analyzed builtin and not live, kill stores.
  if (live_mgr->IsAnalyzedBuiltin(builtin) && !IsLiveBuiltin(builtin))
    KillAllStoresOfRef(ref);
}